

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopUtil.c
# Opt level: O3

void Hop_ObjCollectMulti_rec(Hop_Obj_t *pRoot,Hop_Obj_t *pObj,Vec_Ptr_t *vSuper)

{
  size_t __size;
  int iVar1;
  uint uVar2;
  void **ppvVar3;
  long lVar4;
  
  for (; (pObj == pRoot ||
         (((((ulong)pObj & 1) == 0 && (uVar2 = *(uint *)&pObj->field_0x20 & 7, uVar2 != 2)) &&
          ((*(uint *)&pRoot->field_0x20 & 7) == uVar2)))); pObj = pObj->pFanin1) {
    Hop_ObjCollectMulti_rec(pRoot,pObj->pFanin0,vSuper);
  }
  iVar1 = vSuper->nSize;
  if (0 < (long)iVar1) {
    lVar4 = 0;
    do {
      if ((Hop_Obj_t *)vSuper->pArray[lVar4] == pObj) {
        return;
      }
      lVar4 = lVar4 + 1;
    } while (iVar1 != lVar4);
  }
  if (iVar1 == vSuper->nCap) {
    if (iVar1 < 0x10) {
      if (vSuper->pArray == (void **)0x0) {
        ppvVar3 = (void **)malloc(0x80);
      }
      else {
        ppvVar3 = (void **)realloc(vSuper->pArray,0x80);
      }
      vSuper->pArray = ppvVar3;
      vSuper->nCap = 0x10;
    }
    else {
      __size = (ulong)(uint)(iVar1 * 2) * 8;
      if (vSuper->pArray == (void **)0x0) {
        ppvVar3 = (void **)malloc(__size);
      }
      else {
        ppvVar3 = (void **)realloc(vSuper->pArray,__size);
      }
      vSuper->pArray = ppvVar3;
      vSuper->nCap = iVar1 * 2;
    }
  }
  else {
    ppvVar3 = vSuper->pArray;
  }
  iVar1 = vSuper->nSize;
  vSuper->nSize = iVar1 + 1;
  ppvVar3[iVar1] = pObj;
  return;
}

Assistant:

void Hop_ObjCollectMulti_rec( Hop_Obj_t * pRoot, Hop_Obj_t * pObj, Vec_Ptr_t * vSuper )
{
    if ( pRoot != pObj && (Hop_IsComplement(pObj) || Hop_ObjIsPi(pObj) || Hop_ObjType(pRoot) != Hop_ObjType(pObj)) )
    {
        Vec_PtrPushUnique(vSuper, pObj);
        return;
    }
    Hop_ObjCollectMulti_rec( pRoot, Hop_ObjChild0(pObj), vSuper );
    Hop_ObjCollectMulti_rec( pRoot, Hop_ObjChild1(pObj), vSuper );
}